

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgetopt.c
# Opt level: O3

int sgetoptmine(int argc,char **argv,char *opts)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar5;
  char chp [2];
  char local_2a [2];
  char *pcVar4;
  
  if (sgetoptprogname == (char *)0x0) {
    pcVar5 = *argv;
    pcVar4 = "";
    pcVar3 = "";
    if (pcVar5 != (char *)0x0) {
      pcVar4 = pcVar5;
      pcVar3 = pcVar5;
    }
    do {
      do {
        sgetoptprogname = pcVar3;
        pcVar3 = pcVar4 + 1;
        cVar1 = *pcVar4;
        pcVar4 = pcVar3;
      } while (cVar1 == '/');
      pcVar3 = sgetoptprogname;
    } while (cVar1 != '\0');
  }
  iVar2 = subgetopt(argc,argv,opts);
  if (iVar2 == 0x3f && sgetopterr != 0) {
    local_2a[0] = (char)subgetoptproblem;
    local_2a[1] = 10;
    buffer_puts(buffer_2,sgetoptprogname);
    pcVar5 = ": illegal option -- ";
    if (argv[subgetoptind] == (char *)0x0) {
      pcVar5 = ": option requires an argument -- ";
    }
    if (argc <= subgetoptind) {
      pcVar5 = ": option requires an argument -- ";
    }
    buffer_puts(buffer_2,pcVar5);
    buffer_put(buffer_2,local_2a,2);
    buffer_flush(buffer_2);
  }
  return iVar2;
}

Assistant:

int getopt(int argc,const char *const *argv,const char *opts)
{
  int c;
  const char *s;

  if (!optprogname) {
    optprogname = *argv;
    if (!optprogname) optprogname = "";
    for (s = optprogname;*s;++s) if (*s == '/') optprogname = s + 1;
  }
  c = subgetopt(argc,argv,opts);
  if (opterr)
    if (c == '?') {
      char chp[2]; chp[0] = optproblem; chp[1] = '\n';
      buffer_puts(buffer_2,optprogname);
      if (argv[optind] && (optind < argc))
        buffer_puts(buffer_2,": illegal option -- ");
      else
        buffer_puts(buffer_2,": option requires an argument -- ");
      buffer_put(buffer_2,chp,2);
      buffer_flush(buffer_2);
    }
  return c;
}